

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O2

void __thiscall OpenMesh::ArrayKernel::assign_connectivity(ArrayKernel *this,ArrayKernel *_other)

{
  PropertyContainer *this_00;
  PropertyContainer *this_01;
  PropertyContainer *this_02;
  PropertyContainer *this_03;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PropertyT<OpenMesh::Attributes::StatusInfo> *pPVar2;
  PropertyT<OpenMesh::Attributes::StatusInfo> *pPVar3;
  BaseHandle BVar4;
  
  std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::
  operator=(&this->vertices_,&_other->vertices_);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::operator=
            (&this->edges_,&_other->edges_);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::operator=
            (&this->faces_,&_other->faces_);
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[2])(this);
  this_00 = &(this->super_BaseKernel).vprops_;
  PropertyContainer::resize(this_00,CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[3])(this);
  this_01 = &(this->super_BaseKernel).hprops_;
  PropertyContainer::resize(this_01,CONCAT44(extraout_var_00,iVar1));
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[4])(this);
  this_02 = &(this->super_BaseKernel).eprops_;
  PropertyContainer::resize(this_02,CONCAT44(extraout_var_01,iVar1));
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[5])(this);
  this_03 = &(this->super_BaseKernel).fprops_;
  PropertyContainer::resize(this_03,CONCAT44(extraout_var_02,iVar1));
  BVar4.idx_ = (_other->vertex_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
               super_BaseHandle.idx_;
  if (BVar4.idx_ != -1) {
    if ((this->vertex_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
        super_BaseHandle.idx_ == -1) {
      request_vertex_status(this);
      BVar4.idx_ = (_other->vertex_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                   super_BaseHandle.idx_;
    }
    pPVar2 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(_other->super_BaseKernel).vprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)BVar4.idx_);
    pPVar3 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (this_00,(BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                                (this->vertex_status_).
                                super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                super_BaseHandle.idx_);
    PropertyT<OpenMesh::Attributes::StatusInfo>::operator=(pPVar3,pPVar2);
  }
  BVar4.idx_ = (_other->halfedge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
               super_BaseHandle.idx_;
  if (BVar4.idx_ != -1) {
    if ((this->halfedge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
        super_BaseHandle.idx_ == -1) {
      request_halfedge_status(this);
      BVar4.idx_ = (_other->halfedge_status_).
                   super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_;
    }
    pPVar2 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(_other->super_BaseKernel).hprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)BVar4.idx_);
    pPVar3 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (this_01,(BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                                (this->halfedge_status_).
                                super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                super_BaseHandle.idx_);
    PropertyT<OpenMesh::Attributes::StatusInfo>::operator=(pPVar3,pPVar2);
  }
  BVar4.idx_ = (_other->edge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
               super_BaseHandle.idx_;
  if (BVar4.idx_ != -1) {
    if ((this->edge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
        super_BaseHandle.idx_ == -1) {
      request_edge_status(this);
      BVar4.idx_ = (_other->edge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                   super_BaseHandle.idx_;
    }
    pPVar2 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(_other->super_BaseKernel).eprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)BVar4.idx_);
    pPVar3 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (this_02,(BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                                (this->edge_status_).
                                super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                super_BaseHandle.idx_);
    PropertyT<OpenMesh::Attributes::StatusInfo>::operator=(pPVar3,pPVar2);
  }
  BVar4.idx_ = (_other->face_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
               super_BaseHandle.idx_;
  if (BVar4.idx_ != -1) {
    if ((this->face_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
        super_BaseHandle.idx_ == -1) {
      request_face_status(this);
      BVar4.idx_ = (_other->face_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                   super_BaseHandle.idx_;
    }
    pPVar2 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(_other->super_BaseKernel).fprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)BVar4.idx_);
    pPVar3 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (this_03,(BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                                (this->face_status_).
                                super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                super_BaseHandle.idx_);
    PropertyT<OpenMesh::Attributes::StatusInfo>::operator=(pPVar3,pPVar2);
    return;
  }
  return;
}

Assistant:

void ArrayKernel::assign_connectivity(const ArrayKernel& _other)
{
  vertices_ = _other.vertices_;
  edges_ = _other.edges_;
  faces_ = _other.faces_;
  
  vprops_resize(n_vertices());
  hprops_resize(n_halfedges());
  eprops_resize(n_edges());
  fprops_resize(n_faces());
  
#define COPY_STATUS_PROPERTY(ENTITY) \
  if (_other.ENTITY##_status_.is_valid()) \
  {   \
    if (!ENTITY##_status_.is_valid()) \
    { \
      request_##ENTITY##_status(); \
    } \
    property(ENTITY##_status_) = _other.property(_other.ENTITY##_status_); \
  }
  COPY_STATUS_PROPERTY(vertex)
  COPY_STATUS_PROPERTY(halfedge)
  COPY_STATUS_PROPERTY(edge)
  COPY_STATUS_PROPERTY(face)
  
#undef COPY_STATUS_PROPERTY
}